

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O0

void __thiscall
TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test::
~TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test
          (TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test *this)

{
  TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test *this_local;
  
  ~TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test(this);
  operator_delete(this,0x270);
  return;
}

Assistant:

TEST_F (TwoConnections, SyncOnSecondConnectionUpdatesFooterPos) {
    {
        auto transaction = pstore::begin (first);
        append_int (transaction, 1);
        transaction.commit ();
    }
    second.sync ();
    EXPECT_EQ (first.footer_pos (), second.footer_pos ());
    second.sync (0U);
    EXPECT_EQ (pstore::leader_size, second.footer_pos ().absolute ());
    second.sync (1U);
    EXPECT_EQ (first.footer_pos (), second.footer_pos ());
    second.sync (0U);
    EXPECT_EQ (pstore::leader_size, second.footer_pos ().absolute ());
}